

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

void __thiscall helics::FederateState::addFederateToDelay(FederateState *this,GlobalFederateId gid)

{
  __normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
  __last;
  bool bVar1;
  reference pvVar2;
  reference this_00;
  BaseType in_ESI;
  value_type *in_RDI;
  value_type *in_stack_00000028;
  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *in_stack_00000030;
  const_iterator in_stack_00000038;
  __normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
  res;
  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
  *in_stack_ffffffffffffff98;
  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
  *in_stack_ffffffffffffffa0;
  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
  *in_stack_ffffffffffffffb0;
  GlobalFederateId *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  __normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
  in_stack_ffffffffffffffc8;
  __normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
  local_20;
  BaseType local_14;
  GlobalFederateId local_4;
  
  local_4.gid = in_ESI;
  bVar1 = std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::empty
                    (in_stack_ffffffffffffffb0);
  if (!bVar1) {
    pvVar2 = std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::back
                       (in_stack_ffffffffffffffa0);
    local_14 = pvVar2->gid;
    bVar1 = GlobalFederateId::operator>(&local_4,(GlobalFederateId)local_14);
    if (!bVar1) {
      std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::begin
                (in_stack_ffffffffffffff98);
      std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::end
                (in_stack_ffffffffffffff98);
      __last._M_current._4_4_ = in_stack_ffffffffffffffc4;
      __last._M_current._0_4_ = in_stack_ffffffffffffffc0;
      local_20 = std::
                 lower_bound<__gnu_cxx::__normal_iterator<helics::GlobalFederateId*,std::vector<helics::GlobalFederateId,std::allocator<helics::GlobalFederateId>>>,helics::GlobalFederateId>
                           (in_stack_ffffffffffffffc8,__last,in_stack_ffffffffffffffb8);
      std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::end
                (in_stack_ffffffffffffff98);
      bVar1 = __gnu_cxx::
              operator==<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                        ((__normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                          *)in_stack_ffffffffffffffa0,
                         (__normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                          *)in_stack_ffffffffffffff98);
      if (bVar1) {
        std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::push_back
                  (in_stack_ffffffffffffffb0,in_RDI);
        return;
      }
      this_00 = __gnu_cxx::
                __normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                ::operator*(&local_20);
      bVar1 = GlobalFederateId::operator!=(this_00,local_4);
      if (!bVar1) {
        return;
      }
      __gnu_cxx::
      __normal_iterator<helics::GlobalFederateId_const*,std::vector<helics::GlobalFederateId,std::allocator<helics::GlobalFederateId>>>
      ::__normal_iterator<helics::GlobalFederateId*>
                ((__normal_iterator<const_helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                  *)(in_RDI + 0x13c),
                 (__normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                  *)in_stack_ffffffffffffff98);
      std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::insert
                (in_stack_00000030,in_stack_00000038,in_stack_00000028);
      return;
    }
  }
  std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::push_back
            (in_stack_ffffffffffffffb0,in_RDI);
  return;
}

Assistant:

void FederateState::addFederateToDelay(GlobalFederateId gid)
{
    if ((delayedFederates.empty()) || (gid > delayedFederates.back())) {
        delayedFederates.push_back(gid);
        return;
    }
    auto res = std::lower_bound(delayedFederates.begin(), delayedFederates.end(), gid);
    if (res == delayedFederates.end()) {
        delayedFederates.push_back(gid);
        return;
    }
    if (*res != gid) {
        delayedFederates.insert(res, gid);
    }
}